

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void __thiscall Heap::sort_down(Heap *this,GridNode *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GridNode **ppGVar6;
  GridNode *pGVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar1 = this->count;
  iVar9 = item->index;
  iVar8 = iVar9 * 2 + 1;
  if (iVar8 < iVar1) {
    iVar2 = item->hCost;
    iVar3 = item->gCost;
    do {
      iVar10 = iVar9 * 2 + 2;
      ppGVar6 = this->list;
      if (iVar10 < iVar1) {
        iVar4 = ppGVar6[iVar10]->hCost;
        iVar5 = ppGVar6[iVar8]->hCost;
        iVar11 = (ppGVar6[iVar10]->gCost + iVar4) - (ppGVar6[iVar8]->gCost + iVar5);
        if (iVar11 == 0) {
          iVar11 = iVar4 - iVar5;
        }
        if (iVar11 < 0) {
          iVar8 = iVar10;
        }
      }
      pGVar7 = ppGVar6[iVar8];
      iVar8 = (pGVar7->gCost + pGVar7->hCost) - (iVar3 + iVar2);
      if (iVar8 == 0) {
        iVar8 = pGVar7->hCost - iVar2;
      }
      if (-1 < iVar8) {
        return;
      }
      iVar8 = pGVar7->index;
      ppGVar6[iVar8] = item;
      this->list[iVar9] = pGVar7;
      iVar9 = iVar9 + iVar8;
      pGVar7->index = iVar9;
      iVar9 = iVar9 - item->index;
      item->index = iVar9;
      pGVar7->index = pGVar7->index - iVar9;
      iVar9 = item->index;
      iVar8 = iVar9 * 2 + 1;
    } while (iVar8 < iVar1);
  }
  return;
}

Assistant:

void sort_down(GridNode *item)
    {
        while (true)
        {
            int childIndex1 = item->index * 2 + 1;
            int childIndex2 = item->index * 2 + 2;
            int newIndex = 0;
            if (childIndex1 < count)
            {
                newIndex = childIndex1;
                if (childIndex2 < count)
                {
                    if (list[childIndex1]->compare_item(list[childIndex2]) < 0)
                    {
                        newIndex = childIndex2;
                    }
                }
                if (item->compare_item(list[newIndex]) < 0)
                {
                    swap_items(list[newIndex], item);
                }
                else
                {
                    return;
                }
            }
            else
            {
                return;
            }
        }
    }